

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O1

bool __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::EvalQuantifier
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          Stack<rapidjson::CrtAllocator> *operandStack,uint n,uint m)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  if (m < n) {
    __assert_fail("n <= m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                  ,0x19c,
                  "bool rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::EvalQuantifier(Stack<Allocator> &, unsigned int, unsigned int) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (0xb < (ulong)((long)operandStack->stackTop_ - (long)operandStack->stack_)) {
    if (n == 0) {
      if (m == 0) {
        bVar1 = false;
      }
      else if (m == 0xffffffff) {
        Eval(this,operandStack,kZeroOrMore);
        bVar1 = true;
      }
      else {
        Eval(this,operandStack,kZeroOrOne);
        bVar1 = true;
        iVar2 = m - 1;
        iVar3 = iVar2;
        if (iVar2 != 0) {
          do {
            CloneTopOperand(this,operandStack);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
          do {
            Eval(this,operandStack,kConcatenation);
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
        }
      }
    }
    else {
      iVar2 = n - 1;
      for (iVar3 = iVar2; iVar3 != 0; iVar3 = iVar3 + -1) {
        CloneTopOperand(this,operandStack);
      }
      if (m == 0xffffffff) {
        Eval(this,operandStack,kOneOrMore);
      }
      else if (n < m) {
        CloneTopOperand(this,operandStack);
        Eval(this,operandStack,kZeroOrOne);
        if (n < m - 1) {
          iVar3 = ~n + m;
          do {
            CloneTopOperand(this,operandStack);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
        iVar3 = m - n;
        if (n <= m && iVar3 != 0) {
          do {
            Eval(this,operandStack,kConcatenation);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
      }
      bVar1 = true;
      for (; iVar2 != 0; iVar2 = iVar2 + -1) {
        Eval(this,operandStack,kConcatenation);
      }
    }
    return bVar1;
  }
  __assert_fail("operandStack.GetSize() >= sizeof(Frag)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                ,0x19d,
                "bool rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::EvalQuantifier(Stack<Allocator> &, unsigned int, unsigned int) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

bool EvalQuantifier(Stack<Allocator>& operandStack, unsigned n, unsigned m) {
        RAPIDJSON_ASSERT(n <= m);
        RAPIDJSON_ASSERT(operandStack.GetSize() >= sizeof(Frag));

        if (n == 0) {
            if (m == 0)                             // a{0} not support
                return false;
            else if (m == kInfinityQuantifier)
                Eval(operandStack, kZeroOrMore);    // a{0,} -> a*
            else {
                Eval(operandStack, kZeroOrOne);         // a{0,5} -> a?
                for (unsigned i = 0; i < m - 1; i++)
                    CloneTopOperand(operandStack);      // a{0,5} -> a? a? a? a? a?
                for (unsigned i = 0; i < m - 1; i++)
                    Eval(operandStack, kConcatenation); // a{0,5} -> a?a?a?a?a?
            }
            return true;
        }

        for (unsigned i = 0; i < n - 1; i++)        // a{3} -> a a a
            CloneTopOperand(operandStack);

        if (m == kInfinityQuantifier)
            Eval(operandStack, kOneOrMore);         // a{3,} -> a a a+
        else if (m > n) {
            CloneTopOperand(operandStack);          // a{3,5} -> a a a a
            Eval(operandStack, kZeroOrOne);         // a{3,5} -> a a a a?
            for (unsigned i = n; i < m - 1; i++)
                CloneTopOperand(operandStack);      // a{3,5} -> a a a a? a?
            for (unsigned i = n; i < m; i++)
                Eval(operandStack, kConcatenation); // a{3,5} -> a a aa?a?
        }

        for (unsigned i = 0; i < n - 1; i++)
            Eval(operandStack, kConcatenation);     // a{3} -> aaa, a{3,} -> aaa+, a{3.5} -> aaaa?a?

        return true;
    }